

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

void __thiscall cmState::~cmState(cmState *this)

{
  cmState *this_local;
  
  std::optional<cmDependencyProvider>::~optional(&this->DependencyProvider);
  std::__cxx11::string::~string((string *)&this->BinaryDirectory);
  std::__cxx11::string::~string((string *)&this->SourceDirectory);
  cmLinkedTree<cmDefinitions>::~cmLinkedTree(&this->VarTree);
  cmLinkedTree<cmStateDetail::SnapshotDataType>::~cmLinkedTree(&this->SnapshotData);
  cmLinkedTree<cmStateDetail::PolicyStackEntry>::~cmLinkedTree(&this->PolicyStack);
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~cmLinkedTree(&this->ExecutionListFiles);
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::~cmLinkedTree
            (&this->BuildsystemDirectory);
  std::unique_ptr<cmGlobVerificationManager,_std::default_delete<cmGlobVerificationManager>_>::
  ~unique_ptr(&this->GlobVerificationManager);
  std::unique_ptr<cmCacheManager,_std::default_delete<cmCacheManager>_>::~unique_ptr
            (&this->CacheManager);
  cmPropertyMap::~cmPropertyMap(&this->GlobalProperties);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set(&this->FlowControlCommands);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>_>_>
  ::~unordered_map(&this->ScriptedCommands);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>_>_>
  ::~unordered_map(&this->BuiltinCommands);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->EnabledLanguages);
  cmPropertyDefinitionMap::~cmPropertyDefinitionMap(&this->PropertyDefinitions);
  return;
}

Assistant:

cmState::~cmState() = default;